

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::get_options
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this)

{
  Display DVar1;
  long in_RSI;
  Machine local_20;
  undefined4 local_14;
  
  local_14 = 1;
  std::make_unique<MSX::Machine::Options,Configurable::OptionsType>((OptionsType *)&local_20);
  DVar1 = MachineTypes::ScanProducer::get_video_signal_configurable((ScanProducer *)(in_RSI + 0x30))
  ;
  *(Display *)(local_20._vptr_Machine + 1) = DVar1;
  *(undefined1 *)((long)local_20._vptr_Machine + 0xc) = *(undefined1 *)(in_RSI + 0x27de9);
  (this->super_Machine)._vptr_Machine = local_20._vptr_Machine;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() final {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			options->quickload = allow_fast_tape_;
			return options;
		}